

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_test.cc
# Opt level: O2

void __thiscall typed_argument_equality::test_method(typed_argument_equality *this)

{
  typed_option<int> *ptVar1;
  typed_option<float> *ptVar2;
  allocator local_3e2;
  allocator local_3e1;
  char *local_3e0;
  char *local_3d8;
  allocator local_3d0 [8];
  undefined8 local_3c8;
  shared_count asStack_3c0 [2];
  float float_loc;
  int int_loc_other;
  int int_loc;
  string local_3a0;
  string local_380;
  string local_360;
  typed_option<float> local_340;
  typed_option<float> local_2a0;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  typed_option<int> arg2;
  typed_option<int> arg1;
  
  std::__cxx11::string::string((string *)&local_360,"int_opt",local_3d0);
  VW::config::typed_option<int>::typed_option(&arg2,&local_360,&int_loc);
  ptVar1 = VW::config::typed_option<int>::default_value(&arg2,4);
  std::__cxx11::string::string((string *)&local_2a0,"Help text",(allocator *)&local_3e0);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  (ptVar1->super_base_option).m_keep = true;
  std::__cxx11::string::string((string *)&local_340,"t",&local_3e2);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_short_name);
  VW::config::typed_option<int>::typed_option(&arg1,ptVar1);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_2a0);
  VW::config::typed_option<int>::~typed_option(&arg2);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::string((string *)&local_380,"int_opt",(allocator *)&local_3e0);
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)&local_2a0,&local_380,&int_loc_other);
  ptVar1 = VW::config::typed_option<int>::default_value((typed_option<int> *)&local_2a0,4);
  std::__cxx11::string::string((string *)&local_340,"Help text",&local_3e2);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  (ptVar1->super_base_option).m_keep = true;
  std::__cxx11::string::string((string *)local_3d0,"t",&local_3e1);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_short_name);
  VW::config::typed_option<int>::typed_option(&arg2,ptVar1);
  std::__cxx11::string::~string((string *)local_3d0);
  std::__cxx11::string::~string((string *)&local_340);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::string::string((string *)&local_3a0,"float_opt",(allocator *)&local_3e0);
  VW::config::typed_option<float>::typed_option(&local_340,&local_3a0,&float_loc);
  ptVar2 = VW::config::typed_option<float>::default_value(&local_340,3.2);
  std::__cxx11::string::string((string *)local_3d0,"f",&local_3e2);
  std::__cxx11::string::_M_assign((string *)&(ptVar2->super_base_option).m_short_name);
  VW::config::typed_option<float>::typed_option(&local_2a0,ptVar2);
  std::__cxx11::string::~string((string *)local_3d0);
  VW::config::typed_option<float>::~typed_option(&local_340);
  std::__cxx11::string::~string((string *)&local_3a0);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_test.cc"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x39);
  local_3d0[0] = (allocator)VW::config::operator==(&arg1,&arg2);
  local_3c8 = 0;
  asStack_3c0[0].pi_ = (sp_counted_base *)0x0;
  local_3e0 = "arg1 == arg2";
  local_3d8 = "";
  local_340.super_base_option.m_name._M_dataplus._M_p._0_1_ = 0;
  local_340.super_base_option._vptr_base_option = (_func_int **)&PTR__lazy_ostream_002be9e0;
  local_340.super_base_option.m_name._M_string_length =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_test.cc"
  ;
  local_198 = "";
  local_340.super_base_option.m_name.field_2._M_allocated_capacity =
       (size_type)(allocator *)&local_3e0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_3c0);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_test.cc"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x3a);
  local_3d0[0] = (allocator)VW::config::operator==(&arg1.super_base_option,&arg2.super_base_option);
  local_3c8 = 0;
  asStack_3c0[0].pi_ = (sp_counted_base *)0x0;
  local_3e0 = "*b1 == *b2";
  local_3d8 = "";
  local_340.super_base_option.m_name._M_dataplus._M_p._0_1_ = 0;
  local_340.super_base_option._vptr_base_option = (_func_int **)&PTR__lazy_ostream_002be9e0;
  local_340.super_base_option.m_name._M_string_length =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_test.cc"
  ;
  local_1c8 = "";
  local_340.super_base_option.m_name.field_2._M_allocated_capacity =
       (size_type)(allocator *)&local_3e0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_3c0);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/test/unit_test/options_test.cc"
  ;
  local_1d8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x3b);
  local_3d0[0] = (allocator)
                 VW::config::operator!=(&arg1.super_base_option,&local_2a0.super_base_option);
  local_3c8 = 0;
  asStack_3c0[0].pi_ = (sp_counted_base *)0x0;
  local_3e0 = "*b1 != *b3";
  local_3d8 = "";
  local_340.super_base_option.m_name._M_dataplus._M_p._0_1_ = 0;
  local_340.super_base_option._vptr_base_option = (_func_int **)&PTR__lazy_ostream_002be9e0;
  local_340.super_base_option.m_name._M_string_length =
       (size_type)&boost::unit_test::lazy_ostream::inst;
  local_340.super_base_option.m_name.field_2._M_allocated_capacity =
       (size_type)(allocator *)&local_3e0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(asStack_3c0);
  VW::config::typed_option<float>::~typed_option(&local_2a0);
  VW::config::typed_option<int>::~typed_option(&arg2);
  VW::config::typed_option<int>::~typed_option(&arg1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(typed_argument_equality) {
  int int_loc;
  int int_loc_other;
  float float_loc;
  auto arg1 = make_option("int_opt", int_loc)
    .default_value(4)
    .help("Help text")
    .keep()
    .short_name("t");

  auto arg2 = make_option("int_opt", int_loc_other)
    .default_value(4)
    .help("Help text")
    .keep()
    .short_name("t");

  auto param_3 = make_option("float_opt", float_loc)
    .default_value(3.2f)
    .short_name("f");

  base_option* b1 = &arg1;
  base_option* b2 = &arg2;
  base_option* b3 = &param_3;

  BOOST_CHECK(arg1 == arg2);
  BOOST_CHECK(*b1 == *b2);
  BOOST_CHECK(*b1 != *b3);
}